

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBDataCollection.cpp
# Opt level: O1

void __thiscall amrex::EBDataCollection::~EBDataCollection(EBDataCollection *this)

{
  MultiCutFab *pMVar1;
  pointer piVar2;
  long lVar3;
  
  if (this->m_cellflags != (FabArray<amrex::EBCellFlagFab> *)0x0) {
    (*(this->m_cellflags->super_FabArrayBase)._vptr_FabArrayBase[1])();
  }
  if (this->m_levelset != (MultiFab *)0x0) {
    (*(this->m_levelset->super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase[1])
              ();
  }
  if (this->m_volfrac != (MultiFab *)0x0) {
    (*(this->m_volfrac->super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase[1])
              ();
  }
  pMVar1 = this->m_centroid;
  if (pMVar1 != (MultiCutFab *)0x0) {
    MultiCutFab::~MultiCutFab(pMVar1);
    operator_delete(pMVar1,0x188);
  }
  pMVar1 = this->m_bndrycent;
  if (pMVar1 != (MultiCutFab *)0x0) {
    MultiCutFab::~MultiCutFab(pMVar1);
    operator_delete(pMVar1,0x188);
  }
  pMVar1 = this->m_bndrynorm;
  if (pMVar1 != (MultiCutFab *)0x0) {
    MultiCutFab::~MultiCutFab(pMVar1);
    operator_delete(pMVar1,0x188);
  }
  pMVar1 = this->m_bndryarea;
  if (pMVar1 != (MultiCutFab *)0x0) {
    MultiCutFab::~MultiCutFab(pMVar1);
    operator_delete(pMVar1,0x188);
  }
  lVar3 = 0x24;
  do {
    pMVar1 = (MultiCutFab *)(this->m_geom).super_CoordSys.offset[lVar3 + -5];
    if (pMVar1 != (MultiCutFab *)0x0) {
      MultiCutFab::~MultiCutFab(pMVar1);
      operator_delete(pMVar1,0x188);
    }
    pMVar1 = (MultiCutFab *)(this->m_geom).super_CoordSys.offset[lVar3 + -2];
    if (pMVar1 != (MultiCutFab *)0x0) {
      MultiCutFab::~MultiCutFab(pMVar1);
      operator_delete(pMVar1,0x188);
    }
    pMVar1 = (MultiCutFab *)(this->m_geom).super_CoordSys.offset[lVar3 + 1];
    if (pMVar1 != (MultiCutFab *)0x0) {
      MultiCutFab::~MultiCutFab(pMVar1);
      operator_delete(pMVar1,0x188);
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x27);
  piVar2 = (this->m_ngrow).super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2,(long)(this->m_ngrow).super_vector<int,_std::allocator<int>_>.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar2);
    return;
  }
  return;
}

Assistant:

EBDataCollection::~EBDataCollection ()
{
    delete m_cellflags;
    delete m_levelset;
    delete m_volfrac;
    delete m_centroid;
    delete m_bndrycent;
    delete m_bndrynorm;
    delete m_bndryarea;
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        delete m_areafrac[idim];
        delete m_facecent[idim];
        delete m_edgecent[idim];
    }
}